

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void whilestat(LexState *ls,int line)

{
  FuncState *fs_00;
  int list;
  undefined1 local_40 [8];
  BlockCnt bl;
  int condexit;
  int whileinit;
  FuncState *fs;
  int line_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  luaX_next(ls);
  bl._20_4_ = luaK_getlabel(fs_00);
  bl._16_4_ = cond(ls);
  enterblock(fs_00,(BlockCnt *)local_40,'\x01');
  checknext(ls,0x103);
  block(ls);
  list = luaK_jump(fs_00);
  luaK_patchlist(fs_00,list,bl._20_4_);
  check_match(ls,0x106,0x116,line);
  leaveblock(fs_00);
  luaK_patchtohere(fs_00,bl._16_4_);
  return;
}

Assistant:

static void whilestat (LexState *ls, int line) {
  /* whilestat -> WHILE cond DO block END */
  FuncState *fs = ls->fs;
  int whileinit;
  int condexit;
  BlockCnt bl;
  luaX_next(ls);  /* skip WHILE */
  whileinit = luaK_getlabel(fs);
  condexit = cond(ls);
  enterblock(fs, &bl, 1);
  checknext(ls, TK_DO);
  block(ls);
  luaK_jumpto(fs, whileinit);
  check_match(ls, TK_END, TK_WHILE, line);
  leaveblock(fs);
  luaK_patchtohere(fs, condexit);  /* false conditions finish the loop */
}